

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

int __thiscall List::printPageByNum(List *this,int currIndex)

{
  ostream *poVar1;
  int pageNumber;
  int local_1c;
  
  std::operator<<((ostream *)&std::cout,"Enter page number: ");
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  CheckCin();
  if ((local_1c < 1) || (this->m_listSize / this->m_pageSize < local_1c)) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "It is impossible to read a page with that number!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    currIndex = printPage(this,this->m_pageSize * (local_1c + -1));
  }
  return currIndex;
}

Assistant:

int printPageByNum(int currIndex) {
        cout << "Enter page number: ";
        int pageNumber;
        cin >> pageNumber;
        CheckCin();
        if (pageNumber <= 0 || pageNumber > m_listSize / m_pageSize) {
            cout << "It is impossible to read a page with that number!" << endl;
            return currIndex;
        } else {
            currIndex = (pageNumber - 1) * m_pageSize;
            currIndex = printPage(currIndex);
        }
        return currIndex;
    }